

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

tcache_t * duckdb_je_tcache_create_explicit(tsd_t *tsd)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  arena_t *paVar6;
  tcache_t *tcache;
  ulong uVar7;
  uintptr_t key;
  _Bool internal;
  cache_bin_info_t *duckdb_je_tcache_bin_info;
  tsd_t *tsd_00;
  size_t usize;
  tcache_t *tcache_00;
  rtree_t *prVar8;
  rtree_metadata_t rVar9;
  size_t tcache_size;
  size_t alignment;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  duckdb_je_cache_bin_info_compute_alloc
            (opt_tcache_ncached_max,duckdb_je_global_do_not_change_tcache_nbins,&tcache_size,
             &alignment);
  uVar4 = (int)tcache_size + 0x79fU & 0xfffffff8;
  uVar5 = (ulong)uVar4;
  if (alignment < 0x1001 && uVar4 < 0x3801) {
    uVar5 = -alignment & (alignment + uVar5) - 1;
    if (uVar5 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar5 + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < uVar5) goto LAB_01e9aae1;
      uVar7 = uVar5 * 2 - 1;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar7 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      usize = ~uVar7 + uVar5 & uVar7;
    }
    uVar7 = 0x4000;
    if (usize < 0x4000) goto LAB_01e9ab1a;
  }
  else {
    if (0x7000000000000000 < alignment) {
LAB_01e9aae1:
      usize = 0;
      goto LAB_01e9ab1a;
    }
    uVar7 = 0x4000;
    if (0x4000 < uVar4) {
      uVar7 = uVar5 * 2 - 1;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar7 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      uVar7 = ~uVar7 + uVar5 & uVar7;
      if (uVar7 < uVar5) goto LAB_01e9aae1;
    }
  }
  usize = 0;
  if (uVar7 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar7) - 0x1000)
  {
    usize = uVar7;
  }
LAB_01e9ab1a:
  tcache_00 = (tcache_t *)0x0;
  paVar6 = arena_get((tsdn_t *)0x0,0,true);
  duckdb_je_tcache_bin_info = (cache_bin_info_t *)0x1;
  tcache = (tcache_t *)
           duckdb_je_arena_palloc
                     ((tsdn_t *)tsd,paVar6,usize,alignment,true,usize < 0x3801,(tcache_t *)0x0);
  if (tcache != (tcache_t *)0x0) {
    if (tsd == (tsd_t *)0x0) {
      prVar8 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar8);
    }
    else {
      prVar8 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,prVar8,(rtree_ctx_t *)tcache,
               (uintptr_t)duckdb_je_tcache_bin_info);
    key = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
    pvVar2 = duckdb_je_arenas[key].repr;
    if (tsd == (tsd_t *)0x0) {
      prVar8 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar8);
    }
    else {
      prVar8 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar9 = rtree_metadata_read((tsdn_t *)tsd,prVar8,(rtree_ctx_t *)tcache,key);
    LOCK();
    plVar1 = (long *)((long)pvVar2 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar9.szind];
    UNLOCK();
    lVar3 = CONCAT44(tcache_size._4_4_,(int)tcache_size);
    tsd_00 = (tsd_t *)((long)tcache[1].bins + lVar3 + -8);
    tcache_00 = (tcache_t *)((long)tcache->bins + lVar3 + -8);
    *(uint *)((long)&tcache[1].bins[1].low_bits_low_water + lVar3) =
         duckdb_je_global_do_not_change_tcache_nbins;
    tcache_init(tsd_00,(tcache_slow_t *)tcache_00,tcache,opt_tcache_ncached_max,
                duckdb_je_tcache_bin_info);
    paVar6 = arena_choose_impl(tsd,(arena_t *)0x1,internal);
    duckdb_je_tcache_arena_associate((tsdn_t *)tsd,(tcache_slow_t *)tsd_00,tcache_00,paVar6);
  }
  return tcache_00;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	/*
	 * We place the cache bin stacks, then the tcache_t, then a pointer to
	 * the beginning of the whole allocation (for freeing).  The makes sure
	 * the cache bins have the requested alignment.
	 */
	unsigned tcache_nbins = global_do_not_change_tcache_nbins;
	size_t tcache_size, alignment;
	cache_bin_info_compute_alloc(tcache_get_default_ncached_max(),
	    tcache_nbins, &tcache_size, &alignment);

	size_t size = tcache_size + sizeof(tcache_t)
	    + sizeof(tcache_slow_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	size = sz_sa2u(size, alignment);

	void *mem = ipallocztm(tsd_tsdn(tsd), size, alignment,
	    true, NULL, true, arena_get(TSDN_NULL, 0, true));
	if (mem == NULL) {
		return NULL;
	}
	tcache_t *tcache = (void *)((byte_t *)mem + tcache_size);
	tcache_slow_t *tcache_slow =
	    (void *)((byte_t *)mem + tcache_size + sizeof(tcache_t));
	tcache_default_settings_init(tcache_slow);
	tcache_init(tsd, tcache_slow, tcache, mem,
	    tcache_get_default_ncached_max());

	tcache_arena_associate(tsd_tsdn(tsd), tcache_slow, tcache,
	    arena_ichoose(tsd, NULL));

	return tcache;
}